

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void __thiscall
chrono::ChContactContainerNSC::ReportAllContactsNSC
          (ChContactContainerNSC *this,
          shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC> *callback)

{
  _ReportAllContactsNSC<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_6_6,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContactsNSC<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_6_3,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContactsNSC<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_3_3,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContactsNSC<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_333_3,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContactsNSC<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_333_6,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContactsNSC<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>>
            (&this->contactlist_333_333,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContactsNSC<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_666_3,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContactsNSC<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_666_6,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContactsNSC<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>>
            (&this->contactlist_666_333,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContactsNSC<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>>
            (&this->contactlist_666_666,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContactsRollingNSC<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_6_6_rolling,
             (callback->
             super___shared_ptr<chrono::ChContactContainerNSC::ReportContactCallbackNSC,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  return;
}

Assistant:

void ChContactContainerNSC::ReportAllContactsNSC(std::shared_ptr<ReportContactCallbackNSC> callback) {
    _ReportAllContactsNSC(contactlist_6_6, callback.get());
    _ReportAllContactsNSC(contactlist_6_3, callback.get());
    _ReportAllContactsNSC(contactlist_3_3, callback.get());
    _ReportAllContactsNSC(contactlist_333_3, callback.get());
    _ReportAllContactsNSC(contactlist_333_6, callback.get());
    _ReportAllContactsNSC(contactlist_333_333, callback.get());
    _ReportAllContactsNSC(contactlist_666_3, callback.get());
    _ReportAllContactsNSC(contactlist_666_6, callback.get());
    _ReportAllContactsNSC(contactlist_666_333, callback.get());
    _ReportAllContactsNSC(contactlist_666_666, callback.get());
    _ReportAllContactsRollingNSC(contactlist_6_6_rolling, callback.get());
}